

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ListColumnData::Append
          (ListColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  bool bVar1;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true> uVar2;
  int iVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  Vector *other;
  BaseStatistics *pBVar5;
  reference pvVar6;
  long lVar7;
  idx_t iVar8;
  idx_t iVar9;
  long lVar10;
  long lVar11;
  idx_t local_190;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true> append_offsets;
  ValidityMask append_mask;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat list_data;
  Vector child_vector;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&list_data);
  Vector::ToUnifiedFormat(vector,count,&list_data);
  pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  iVar3 = (*pCVar4->_vptr_ColumnData[3])();
  append_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
  append_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  append_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  append_mask.super_TemplatedValidityMask<unsigned_long>.capacity = count;
  append_offsets.super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)
       operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8);
  bVar1 = true;
  local_190 = 0;
  for (iVar8 = 0;
      uVar2.super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           append_offsets.super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
           _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl, count != iVar8;
      iVar8 = iVar8 + 1) {
    iVar9 = iVar8;
    if ((list_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar9 = (idx_t)(list_data.sel)->sel_vector[iVar8];
    }
    if ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar9 >> 6] >>
         (iVar9 & 0x3f) & 1) != 0)) {
      lVar11 = iVar9 * 0x10;
      iVar9 = *(idx_t *)(list_data.data + lVar11);
      lVar7 = *(long *)(list_data.data + lVar11 + 8);
      unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::AssertNotNull
                (append_offsets.
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
                 (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
                 0x0);
      bVar1 = (bool)(bVar1 & iVar9 == local_190);
      *(idx_t *)((long)uVar2.
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + iVar8 * 8) =
           lVar7 + CONCAT44(extraout_var,iVar3) + local_190;
      local_190 = local_190 + *(long *)(list_data.data + lVar11 + 8);
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&append_mask.super_TemplatedValidityMask<unsigned_long>,iVar8);
      uVar2 = append_offsets;
      unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>,_true>::AssertNotNull
                (append_offsets.
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl ==
                 (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
                 0x0);
      *(idx_t *)((long)uVar2.
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl + iVar8 * 8) =
           local_190 + CONCAT44(extraout_var,iVar3);
    }
  }
  other = ListVector::GetEntry(vector);
  Vector::Vector(&child_vector,other);
  if (!bVar1) {
    SelectionVector::SelectionVector((SelectionVector *)&vdata,local_190);
    lVar7 = 0;
    for (iVar8 = 0; iVar8 != count; iVar8 = iVar8 + 1) {
      iVar9 = iVar8;
      if ((list_data.sel)->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)(list_data.sel)->sel_vector[iVar8];
      }
      if ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar9 >> 6]
           >> (iVar9 & 0x3f) & 1) != 0)) {
        lVar11 = *(long *)(list_data.data + iVar9 * 0x10 + 8);
        for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
          *(int *)((long)&(vdata.sel)->sel_vector + lVar10 * 4 + lVar7 * 4) =
               *(int *)(list_data.data + iVar9 * 0x10) + (int)lVar10;
        }
        lVar7 = lVar7 + lVar10;
      }
    }
    Vector::Slice(&child_vector,other,(SelectionVector *)&vdata,local_190);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vdata.validity);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  vdata.sel = FlatVector::IncrementalSelectionVector();
  vdata.data = (data_ptr_t)
               append_offsets.
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (local_190 != 0) {
    pCVar4 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    pBVar5 = ListStats::GetChildStats(stats);
    pvVar6 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,1);
    (*pCVar4->_vptr_ColumnData[0x12])(pCVar4,pBVar5,pvVar6,&child_vector,local_190);
  }
  ColumnData::AppendData(&this->super_ColumnData,stats,state,&vdata,count);
  TemplatedValidityMask<unsigned_long>::operator=
            (&vdata.validity.super_TemplatedValidityMask<unsigned_long>,
             &append_mask.super_TemplatedValidityMask<unsigned_long>);
  pvVar6 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,0);
  ValidityColumnData::AppendData(&this->validity,stats,pvVar6,&vdata,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  Vector::~Vector(&child_vector);
  ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&append_offsets.
              super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&append_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  UnifiedVectorFormat::~UnifiedVectorFormat(&list_data);
  return;
}

Assistant:

void ListColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	D_ASSERT(count > 0);
	UnifiedVectorFormat list_data;
	vector.ToUnifiedFormat(count, list_data);
	auto &list_validity = list_data.validity;

	// construct the list_entry_t entries to append to the column data
	auto input_offsets = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	auto start_offset = child_column->GetMaxEntry();
	idx_t child_count = 0;

	ValidityMask append_mask(count);
	auto append_offsets = unique_ptr<uint64_t[]>(new uint64_t[count]);
	bool child_contiguous = true;
	for (idx_t i = 0; i < count; i++) {
		auto input_idx = list_data.sel->get_index(i);
		if (list_validity.RowIsValid(input_idx)) {
			auto &input_list = input_offsets[input_idx];
			if (input_list.offset != child_count) {
				child_contiguous = false;
			}
			append_offsets[i] = start_offset + child_count + input_list.length;
			child_count += input_list.length;
		} else {
			append_mask.SetInvalid(i);
			append_offsets[i] = start_offset + child_count;
		}
	}
	auto &list_child = ListVector::GetEntry(vector);
	Vector child_vector(list_child);
	if (!child_contiguous) {
		// if the child of the list vector is a non-contiguous vector (i.e. list elements are repeating or have gaps)
		// we first push a selection vector and flatten the child vector to turn it into a contiguous vector
		SelectionVector child_sel(child_count);
		idx_t current_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto input_idx = list_data.sel->get_index(i);
			if (list_validity.RowIsValid(input_idx)) {
				auto &input_list = input_offsets[input_idx];
				for (idx_t list_idx = 0; list_idx < input_list.length; list_idx++) {
					child_sel.set_index(current_count++, input_list.offset + list_idx);
				}
			}
		}
		D_ASSERT(current_count == child_count);
		child_vector.Slice(list_child, child_sel, child_count);
	}

	UnifiedVectorFormat vdata;
	vdata.sel = FlatVector::IncrementalSelectionVector();
	vdata.data = data_ptr_cast(append_offsets.get());

	// append the child vector
	if (child_count > 0) {
		child_column->Append(ListStats::GetChildStats(stats), state.child_appends[1], child_vector, child_count);
	}
	// append the list offsets
	ColumnData::AppendData(stats, state, vdata, count);
	// append the validity data
	vdata.validity = append_mask;
	validity.AppendData(stats, state.child_appends[0], vdata, count);
}